

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreaction.hh
# Opt level: O2

void __thiscall ActionDynamicSymbols::ActionDynamicSymbols(ActionDynamicSymbols *this,string *g)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"dynamicsymbols",&local_39);
  Action::Action(&this->super_Action,8,&local_38,g);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_Action)._vptr_Action = (_func_int **)&PTR__Action_003fc300;
  return;
}

Assistant:

ActionDynamicSymbols(const string &g) : Action(rule_onceperfunc,"dynamicsymbols",g) {}